

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Code_domain_impl::string_ref::string_ref(string_ref *this,char *str)

{
  pointer pcVar1;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  size_t len;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  size_t local_20;
  char *local_18;
  
  (this->super_string_ref)._state[2] = (void *)0x0;
  (this->super_string_ref)._state[0] = (void *)0x0;
  (this->super_string_ref)._state[1] = (void *)0x0;
  (this->super_string_ref)._begin = (pointer)0x0;
  (this->super_string_ref)._end = (pointer)0x0;
  (this->super_string_ref)._thunk = _custom_string_thunk;
  local_18 = str;
  local_20 = strlen(str);
  std::make_shared<std::__cxx11::string,char_const*&,unsigned_long&>
            ((char **)&local_30,(unsigned_long *)&local_18);
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(this->super_string_ref)._state,&local_30);
  pcVar1 = ((local_30._M_ptr)->_M_dataplus)._M_p;
  (this->super_string_ref)._begin = pcVar1;
  (this->super_string_ref)._end = pcVar1 + (local_30._M_ptr)->_M_string_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

explicit string_ref(const char *str)
        : _base::string_ref(_custom_string_thunk)
    {
      static_assert(sizeof(shared_ptr_type) <= sizeof(this->_state), "A shared_ptr does not fit into status_code's state");
      auto len = strlen(str);
      auto p = std::make_shared<std::string>(str, len);
      new(reinterpret_cast<shared_ptr_type *>(this->_state)) shared_ptr_type(p);  // NOLINT
      this->_begin = p->data();
      this->_end = p->data() + p->size();                                         // NOLINT
    }